

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

OrphanBuilder *
capnp::_::OrphanBuilder::initData
          (OrphanBuilder *__return_storage_ptr__,BuilderArena *arena,CapTableBuilder *capTable,
          ByteCount size)

{
  undefined1 auVar1 [16];
  uint uVar2;
  int iVar3;
  uint amount;
  AllocateResult AVar4;
  ThrowOverflow local_21;
  
  __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
  __return_storage_ptr__->location = (word *)0x0;
  (__return_storage_ptr__->tag).content = 0;
  __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
  uVar2 = assertMaxBits<29u,unsigned_int,kj::ThrowOverflow>(size,&local_21);
  amount = uVar2 + 7 >> 3;
  if (arena == (BuilderArena *)0x0) {
    iVar3 = ((uint)(_DAT_00000028 - (long)__return_storage_ptr__ >> 1) & 0xfffffffc) - 3;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = _DAT_00000028;
    AVar4 = (AllocateResult)(auVar1 << 0x40);
    _DAT_00000028 = _DAT_00000028 + (ulong)amount * 8;
  }
  else {
    AVar4 = BuilderArena::allocate(arena,amount);
    iVar3 = -3;
  }
  *(int *)&(__return_storage_ptr__->tag).content = iVar3;
  *(uint *)((long)&(__return_storage_ptr__->tag).content + 4) = uVar2 * 8 + 2;
  __return_storage_ptr__->segment = AVar4.segment;
  __return_storage_ptr__->capTable = capTable;
  __return_storage_ptr__->location = AVar4.words;
  return __return_storage_ptr__;
}

Assistant:

OrphanBuilder OrphanBuilder::initData(
    BuilderArena* arena, CapTableBuilder* capTable, ByteCount size) {
  OrphanBuilder result;
  auto allocation = WireHelpers::initDataPointer(result.tagAsPtr(), nullptr, capTable,
      assertMaxBits<BLOB_SIZE_BITS>(size), arena);
  result.segment = allocation.segment;
  result.capTable = capTable;
  result.location = reinterpret_cast<word*>(allocation.value.begin());
  return result;
}